

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveVCProcess.cpp
# Opt level: O0

void ArrayDelete<aiAnimation>(aiAnimation ***in,uint *num)

{
  aiAnimation *this;
  uint local_1c;
  uint i;
  uint *num_local;
  aiAnimation ***in_local;
  
  for (local_1c = 0; local_1c < *num; local_1c = local_1c + 1) {
    this = (*in)[local_1c];
    if (this != (aiAnimation *)0x0) {
      aiAnimation::~aiAnimation(this);
      operator_delete(this,0x448);
    }
  }
  if (*in != (aiAnimation **)0x0) {
    operator_delete__(*in);
  }
  *in = (aiAnimation **)0x0;
  *num = 0;
  return;
}

Assistant:

inline void ArrayDelete(T**& in, unsigned int& num)
{
    for (unsigned int i = 0; i < num; ++i)
        delete in[i];

    delete[] in;
    in = NULL;
    num = 0;
}